

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O1

void coll_tmap_foreach(coll_tmap_t *map,_func_void_void_ptr_void_ptr *visit)

{
  coll_tmap_entry_t *pcVar1;
  coll_tmap_entry_t *pcVar2;
  coll_tmap_entry_t *pcVar3;
  coll_tmap_entry_t *pcVar4;
  bool bVar5;
  
  pcVar1 = map->root;
  if (map->root == (coll_tmap_entry_t *)0x0) {
    pcVar2 = (coll_tmap_entry_t *)0x0;
  }
  else {
    do {
      pcVar2 = pcVar1;
      pcVar1 = pcVar2->left;
    } while (pcVar2->left != (coll_tmap_entry_t *)0x0);
  }
  do {
    if (pcVar2 == (coll_tmap_entry_t *)0x0) {
      return;
    }
    pcVar1 = pcVar2->right;
    pcVar3 = pcVar2;
    if (pcVar2->right == (coll_tmap_entry_t *)0x0) {
      do {
        pcVar4 = pcVar3->parent;
        if (pcVar4 == (coll_tmap_entry_t *)0x0) break;
        bVar5 = pcVar4->right == pcVar3;
        pcVar3 = pcVar4;
      } while (bVar5);
    }
    else {
      do {
        pcVar4 = pcVar1;
        pcVar1 = pcVar4->left;
      } while (pcVar4->left != (coll_tmap_entry_t *)0x0);
    }
    (*visit)(pcVar2->key,pcVar2->val);
    pcVar2 = pcVar4;
  } while( true );
}

Assistant:

void coll_tmap_foreach(coll_tmap_t *map, void (*visit)(void *, void *)) {
    entry_t *cur = entry_first(map->root);
    while (cur) {
        entry_t *next = entry_next(cur);
        visit(cur->key, cur->val);
        cur = next;
    }
}